

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O0

void __thiscall
Rml::FilterBasicInstancer::FilterBasicInstancer
          (FilterBasicInstancer *this,ValueType value_type,char *default_value)

{
  char *pcVar1;
  PropertyId PVar2;
  PropertyDefinition *pPVar3;
  allocator<char> local_1b9;
  String local_1b8;
  allocator<char> local_191;
  String local_190;
  allocator<char> local_169;
  String local_168;
  allocator<char> local_141;
  String local_140;
  allocator<char> local_119;
  String local_118;
  allocator<char> local_f1;
  String local_f0;
  allocator<char> local_c9;
  String local_c8;
  allocator<char> local_a1;
  String local_a0;
  allocator<char> local_79;
  String local_78;
  allocator<char> local_41;
  String local_40;
  char *local_20;
  char *default_value_local;
  FilterBasicInstancer *pFStack_10;
  ValueType value_type_local;
  FilterBasicInstancer *this_local;
  
  local_20 = default_value;
  default_value_local._4_4_ = value_type;
  pFStack_10 = this;
  FilterInstancer::FilterInstancer(&this->super_FilterInstancer);
  (this->super_FilterInstancer)._vptr_FilterInstancer =
       (_func_int **)&PTR__FilterBasicInstancer_008176b8;
  (this->ids).value = Invalid;
  if (default_value_local._4_4_ == NumberPercent) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"value",&local_41);
    pcVar1 = local_20;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
    pPVar3 = EffectSpecification::RegisterProperty
                       (&(this->super_FilterInstancer).super_EffectSpecification,&local_40,&local_78
                       );
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"number_percent",&local_a1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_a0,&local_c8);
    PVar2 = PropertyDefinition::GetId(pPVar3);
    (this->ids).value = PVar2;
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::allocator<char>::~allocator(&local_c9);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::allocator<char>::~allocator(&local_a1);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::allocator<char>::~allocator(&local_79);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator(&local_41);
  }
  else if (default_value_local._4_4_ == Angle) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"value",&local_f1);
    pcVar1 = local_20;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar1,&local_119);
    pPVar3 = EffectSpecification::RegisterProperty
                       (&(this->super_FilterInstancer).super_EffectSpecification,&local_f0,
                        &local_118);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"angle",&local_141);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_140,&local_168);
    PVar2 = PropertyDefinition::GetId(pPVar3);
    (this->ids).value = PVar2;
    ::std::__cxx11::string::~string((string *)&local_168);
    ::std::allocator<char>::~allocator(&local_169);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::allocator<char>::~allocator(&local_141);
    ::std::__cxx11::string::~string((string *)&local_118);
    ::std::allocator<char>::~allocator(&local_119);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::allocator<char>::~allocator(&local_f1);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"filter",&local_191);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"value",&local_1b9);
  EffectSpecification::RegisterShorthand
            (&(this->super_FilterInstancer).super_EffectSpecification,&local_190,&local_1b8,
             FallThrough);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::allocator<char>::~allocator(&local_1b9);
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::allocator<char>::~allocator(&local_191);
  return;
}

Assistant:

FilterBasicInstancer::FilterBasicInstancer(ValueType value_type, const char* default_value)
{
	switch (value_type)
	{
	case ValueType::NumberPercent: ids.value = RegisterProperty("value", default_value).AddParser("number_percent").GetId(); break;
	case ValueType::Angle: ids.value = RegisterProperty("value", default_value).AddParser("angle").GetId(); break;
	}

	RegisterShorthand("filter", "value", ShorthandType::FallThrough);
}